

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::VariableExpression::derivative(VariableExpression *this,VariableExpressionPtr *variable)

{
  __shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Constant *in_RDI;
  BaseExpressionPtr BVar1;
  Constant *arg;
  undefined1 local_48 [72];
  
  arg = in_RDI;
  std::__shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>::get(in_RDX);
  Constant::Constant(in_RDI,(double)local_48);
  BaseExpression::makePtr<Kandinsky::Constant>(arg);
  Constant::~Constant((Constant *)0x117f35);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &arg->super_BaseExpression;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr VariableExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(Constant(variable.get() == this));
    }